

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_helper.h
# Opt level: O0

void __thiscall spdlog::details::file_helper::~file_helper(file_helper *this)

{
  int in_ESI;
  file_helper *this_local;
  
  close(this,in_ESI);
  std::__cxx11::string::~string((string *)&this->_filename);
  return;
}

Assistant:

~file_helper()
    {
        close();
    }